

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int GA_Compare_distr(int g_a,int g_b)

{
  logical lVar1;
  
  lVar1 = pnga_compare_distr((long)g_a,(long)g_b);
  return (int)(lVar1 != 1);
}

Assistant:

int GA_Compare_distr(int g_a, int g_b)
{
    logical st;
    Integer a=(Integer)g_a;
    Integer b=(Integer)g_b;
    st = wnga_compare_distr(a,b);
    if(st == TRUE) return 0;
    else return 1;
}